

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

HT_Boolean ht_tcp_server_write_to_socket(HT_TCPServer *server,int sock_fd,char *buffer,size_t size)

{
  ssize_t sVar1;
  ulong uStack_38;
  int n;
  size_t sent;
  size_t size_local;
  char *buffer_local;
  int sock_fd_local;
  HT_TCPServer *server_local;
  
  if (size != 0) {
    for (uStack_38 = 0; uStack_38 < size; uStack_38 = (long)(int)sVar1 + uStack_38) {
      sVar1 = send(sock_fd,buffer + uStack_38,size - uStack_38,0);
      if ((int)sVar1 < 1) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

HT_Boolean
ht_tcp_server_write_to_socket(HT_TCPServer* server, int sock_fd, char* buffer, size_t size)
{
    (void) server;
    if (size == 0)
    {
        return HT_TRUE;
    }

    size_t sent = 0;

    while (sent < size)
    {
        int n = send(sock_fd, buffer + sent, size - sent, 0);

        if (n <= 0)
        {
            return HT_FALSE;
        }

        sent += n;
    }

    return HT_TRUE;
}